

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::PerformDefaultAction
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args,
          string *call_description)

{
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  Action<unsigned_char_(unsigned_short)> *this_00;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  OnCallSpec<unsigned_char_(unsigned_short)> *this_01;
  string message;
  _Head_base<0UL,_unsigned_short,_false> local_52;
  long *local_50 [2];
  long local_40 [2];
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (OnCallSpec<unsigned_char_(unsigned_short)> *)0x0;
      break;
    }
    this_01 = (OnCallSpec<unsigned_char_(unsigned_short)> *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    bVar2 = OnCallSpec<unsigned_char_(unsigned_short)>::Matches(this_01,args);
  } while (!bVar2);
  if (this_01 == (OnCallSpec<unsigned_char_(unsigned_short)> *)0x0) {
    pcVar1 = (call_description->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
    std::__cxx11::string::append((char *)local_50);
    if (DefaultValue<unsigned_char>::producer_ == (long *)0x0) {
      RVar3 = '\0';
    }
    else {
      RVar3 = (**(code **)(*DefaultValue<unsigned_char>::producer_ + 0x10))();
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    this_00 = OnCallSpec<unsigned_char_(unsigned_short)>::GetAction(this_01);
    local_52._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_short>).super__Head_base<0UL,_unsigned_short,_false>
         ._M_head_impl;
    RVar3 = Action<unsigned_char_(unsigned_short)>::Perform(this_00,(ArgumentTuple *)&local_52);
  }
  return RVar3;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }